

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratorManagerPlugin.cpp
# Opt level: O1

void __thiscall GeneratorManagerPlugin::GeneratorManagerPlugin(GeneratorManagerPlugin *this)

{
  (this->super_StdPluginLib).m_dependencies.
  super__Vector_base<std::shared_ptr<plugin::Dependency>,_std::allocator<std::shared_ptr<plugin::Dependency>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_StdPluginLib).m_dependencies.
  super__Vector_base<std::shared_ptr<plugin::Dependency>,_std::allocator<std::shared_ptr<plugin::Dependency>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_StdPluginLib).m_extensions.
  super__Vector_base<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_StdPluginLib).m_dependencies.
  super__Vector_base<std::shared_ptr<plugin::Dependency>,_std::allocator<std::shared_ptr<plugin::Dependency>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_StdPluginLib).m_extensions.
  super__Vector_base<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_StdPluginLib).m_extensions.
  super__Vector_base<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_StdPluginLib).super_IPluginLib._vptr_IPluginLib =
       (_func_int **)&PTR__GeneratorManagerPlugin_00108b68;
  plugin::StdPluginLib::AddExtension<GeneratorManagerImpl>
            ((StdPluginLib *)&this->m_generatorManager);
  plugin::StdPluginLib::AddDependency<plugin::interfaces::INumberGenerator>
            (&this->super_StdPluginLib,0,2);
  return;
}

Assistant:

GeneratorManagerPlugin::GeneratorManagerPlugin():
    m_generatorManager(AddExtension<GeneratorManagerImpl>())

{
    AddDependency<plugin::interfaces::INumberGenerator>(0, 2);
}